

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O2

int __thiscall OpenMD::StringTokenizer::nextTokenAsInt(StringTokenizer *this)

{
  int iVar1;
  string token;
  string local_30;
  
  nextToken_abi_cxx11_(&local_30,this);
  iVar1 = atoi(local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  return iVar1;
}

Assistant:

int StringTokenizer::nextTokenAsInt() {
    std::string token = nextToken();

    return atoi(token.c_str());
  }